

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Aig_Man_t * Pdr_ManDupAigWithClauses(Aig_Man_t *p,Vec_Ptr_t *vCubes)

{
  char *pcVar1;
  void *pvVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  uint uVar10;
  Aig_Obj_t *p1;
  long lVar11;
  Aig_Man_t *pAVar12;
  long lVar13;
  int iVar14;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar13];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar13 = lVar13 + 1;
      pVVar8 = p->vCis;
    } while (lVar13 < pVVar8->nSize);
  }
  if (0 < vCubes->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = vCubes->pArray[lVar13];
      pAVar6 = p_00->pConst1;
      if (0 < *(int *)((long)pvVar2 + 0x10)) {
        lVar11 = 0;
        do {
          uVar3 = *(uint *)((long)pvVar2 + lVar11 * 4 + 0x14);
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nRegs <= (int)(uVar3 >> 1)) {
            __assert_fail("Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x13a,"Aig_Man_t *Pdr_ManDupAigWithClauses(Aig_Man_t *, Vec_Ptr_t *)");
          }
          uVar10 = (uVar3 >> 1) + p->nTruePis;
          if (((int)uVar10 < 0) || (p_00->vCis->nSize <= (int)uVar10)) goto LAB_005f0ab5;
          pAVar6 = Aig_And(p_00,pAVar6,
                           (Aig_Obj_t *)((ulong)(uVar3 & 1) ^ (ulong)p_00->vCis->pArray[uVar10]));
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)pvVar2 + 0x10));
      }
      Aig_ObjCreateCo(p_00,pAVar6);
      lVar13 = lVar13 + 1;
    } while (lVar13 < vCubes->nSize);
  }
  pVVar8 = p->vObjs;
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar8->pArray[lVar13];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar2 & 1) != 0) goto LAB_005f0b12;
        uVar7 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar6 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar6 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        uVar7 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar6 = Aig_And(p_00,pAVar6,p1);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
        pVVar8 = p->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar8->nSize);
  }
  if (0 < p->nRegs) {
    iVar14 = 0;
    do {
      uVar3 = p->nTruePos + iVar14;
      if (((int)uVar3 < 0) || (p->vCos->nSize <= (int)uVar3)) {
LAB_005f0ab5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = p->vCos->pArray[uVar3];
      if (((ulong)pvVar2 & 1) != 0) {
LAB_005f0b12:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar2 + 8);
      uVar9 = uVar7 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      Aig_ObjCreateCo(p_00,pAVar6);
      iVar14 = iVar14 + 1;
    } while (iVar14 < p->nRegs);
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  pAVar12 = p_00;
  iVar14 = Aig_ManCheck(p_00);
  if (iVar14 == 0) {
    Abc_Print((int)pAVar12,"Aig_ManDupSimple(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Pdr_ManDupAigWithClauses( Aig_Man_t * p, Vec_Ptr_t * vCubes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew, * pLit;
    Pdr_Set_t * pCube;
    int i, n;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create outputs for each cube
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
//        Pdr_SetPrintOne( pCube );
        pObjNew = Aig_ManConst1(pNew);
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p) );
            pLit = Aig_NotCond( Aig_ManCi(pNew, Saig_ManPiNum(p) + Abc_Lit2Var(pCube->Lits[n])), Abc_LitIsCompl(pCube->Lits[n]) );
            pObjNew = Aig_And( pNew, pObjNew, pLit );
        }
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Saig_ManForEachLi( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        Abc_Print(1, "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}